

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

uint16_t GetListenPort(void)

{
  bool bVar1;
  DNSLookupFn dns_lookup_function;
  undefined8 uVar2;
  bool bVar3;
  uint16_t uVar4;
  CChainParams *pCVar5;
  int64_t iVar6;
  uint16_t unaff_BX;
  NetWhitebindPermissions *this;
  string *name;
  long in_FS_OFFSET;
  bilingual_str error;
  undefined8 in_stack_ffffffffffffff18;
  string *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined8 in_stack_ffffffffffffff30;
  _Any_data local_c8;
  code *local_b8;
  direct_or_indirect local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  ulong local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  NetWhitebindPermissions local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.indirect_contents.indirect = (char *)&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"-bind","");
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_68,&gArgs,(string *)&local_a8.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.indirect_contents.indirect != &local_98) {
    operator_delete(local_a8.indirect_contents.indirect,
                    CONCAT44(local_98._M_allocated_capacity._4_4_,
                             local_98._M_allocated_capacity._0_4_) + 1);
  }
  uVar2 = local_68.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect;
  name = (string *)CONCAT44(local_68._4_4_,local_68.super_NetPermissions.m_flags);
  if (name != (string *)local_68.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect)
  {
    do {
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)&local_c8,&g_dns_lookup_abi_cxx11_);
      dns_lookup_function.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffff20;
      dns_lookup_function.super__Function_base._M_functor._M_unused._M_object =
           (void *)in_stack_ffffffffffffff18;
      dns_lookup_function.super__Function_base._M_manager = (_Manager_type)in_stack_ffffffffffffff28
      ;
      dns_lookup_function._M_invoker = (_Invoker_type)in_stack_ffffffffffffff30;
      Lookup((optional<CService> *)&local_a8.indirect_contents,name,0,false,dns_lookup_function);
      if (local_b8 != (code *)0x0) {
        (*local_b8)(&local_c8,&local_c8,__destroy_functor);
      }
      bVar1 = true;
      if (((char)local_80 == '\x01') &&
         (uVar4 = CService::GetPort((CService *)&local_a8.indirect_contents), uVar4 != 0)) {
        unaff_BX = CService::GetPort((CService *)&local_a8.indirect_contents);
        bVar1 = false;
      }
      if (((char)local_80 == '\x01') &&
         (local_80 = local_80 & 0xffffffffffffff00,
         0x10 < (uint)local_98._M_allocated_capacity._0_4_)) {
        free(local_a8.indirect_contents.indirect);
      }
      if (!bVar1) {
        this = &local_68;
        goto LAB_0019be0f;
      }
      name = name + 1;
    } while (name != (string *)uVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_68);
  local_a8.indirect_contents.indirect = (char *)&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"-whitebind","");
  ArgsManager::GetArgs
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffff20,&gArgs,(string *)&local_a8.indirect_contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.indirect_contents.indirect != &local_98) {
    operator_delete(local_a8.indirect_contents.indirect,
                    CONCAT44(local_98._M_allocated_capacity._4_4_,
                             local_98._M_allocated_capacity._0_4_) + 1);
  }
  if (in_stack_ffffffffffffff20 != (string *)in_stack_ffffffffffffff28) {
    do {
      CService::CService(&local_68.m_service);
      local_a8.indirect_contents.indirect = (char *)&local_98;
      local_a8._8_8_ = 0;
      local_98._M_allocated_capacity._0_4_ = local_98._M_allocated_capacity._0_4_ & 0xffffff00;
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      local_88 = &local_78;
      bVar3 = NetWhitebindPermissions::TryParse
                        (in_stack_ffffffffffffff20,&local_68,
                         (bilingual_str *)&local_a8.indirect_contents);
      bVar1 = true;
      if ((bVar3) && ((~local_68.super_NetPermissions.m_flags & 0x50) != 0)) {
        unaff_BX = CService::GetPort(&local_68.m_service);
        bVar1 = false;
      }
      if (local_88 != &local_78) {
        operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                          local_78._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8.indirect_contents.indirect != &local_98) {
        operator_delete(local_a8.indirect_contents.indirect,
                        CONCAT44(local_98._M_allocated_capacity._4_4_,
                                 local_98._M_allocated_capacity._0_4_) + 1);
      }
      if (0x10 < local_68.m_service.super_CNetAddr.m_addr._size) {
        free(local_68.m_service.super_CNetAddr.m_addr._union.indirect_contents.indirect);
      }
      if (!bVar1) {
        this = (NetWhitebindPermissions *)&stack0xffffffffffffff20;
LAB_0019be0f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this);
        goto LAB_0019be14;
      }
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff20 + 1;
    } while (in_stack_ffffffffffffff20 != (string *)in_stack_ffffffffffffff28);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xffffffffffffff20);
  local_a8.indirect_contents.indirect = (char *)&local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"-port","");
  pCVar5 = Params();
  iVar6 = ArgsManager::GetIntArg
                    (&gArgs,(string *)&local_a8.indirect_contents,(ulong)pCVar5->nDefaultPort);
  unaff_BX = (uint16_t)iVar6;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.indirect_contents.indirect != &local_98) {
    operator_delete(local_a8.indirect_contents.indirect,
                    CONCAT44(local_98._M_allocated_capacity._4_4_,
                             local_98._M_allocated_capacity._0_4_) + 1);
  }
LAB_0019be14:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return unaff_BX;
}

Assistant:

uint16_t GetListenPort()
{
    // If -bind= is provided with ":port" part, use that (first one if multiple are provided).
    for (const std::string& bind_arg : gArgs.GetArgs("-bind")) {
        constexpr uint16_t dummy_port = 0;

        const std::optional<CService> bind_addr{Lookup(bind_arg, dummy_port, /*fAllowLookup=*/false)};
        if (bind_addr.has_value() && bind_addr->GetPort() != dummy_port) return bind_addr->GetPort();
    }

    // Otherwise, if -whitebind= without NetPermissionFlags::NoBan is provided, use that
    // (-whitebind= is required to have ":port").
    for (const std::string& whitebind_arg : gArgs.GetArgs("-whitebind")) {
        NetWhitebindPermissions whitebind;
        bilingual_str error;
        if (NetWhitebindPermissions::TryParse(whitebind_arg, whitebind, error)) {
            if (!NetPermissions::HasFlag(whitebind.m_flags, NetPermissionFlags::NoBan)) {
                return whitebind.m_service.GetPort();
            }
        }
    }

    // Otherwise, if -port= is provided, use that. Otherwise use the default port.
    return static_cast<uint16_t>(gArgs.GetIntArg("-port", Params().GetDefaultPort()));
}